

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_cadd_bit(secp256k1_scalar *r,uint bit,int flag)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint extraout_EDX;
  secp256k1_ge *a;
  undefined4 in_register_00000034;
  secp256k1_gej *psVar8;
  secp256k1_gej *a_00;
  secp256k1_ge *psVar9;
  ulong uVar10;
  secp256k1_ge *a_01;
  ulong uVar11;
  int vflag;
  secp256k1_fe sStack_c8;
  secp256k1_fe sStack_98;
  ulong uStack_68;
  
  psVar8 = (secp256k1_gej *)CONCAT44(in_register_00000034,bit);
  psVar9 = (secp256k1_ge *)r;
  secp256k1_scalar_verify(r);
  if (bit < 0x100) {
    uVar6 = flag - 1U & 0x100 | bit;
    uVar7 = uVar6 >> 6;
    bVar5 = (byte)bit;
    uVar4 = (ulong)(uVar6 < 0x40) << (bVar5 & 0x3f);
    psVar8 = (secp256k1_gej *)((ulong)(uVar7 == 1) << (bVar5 & 0x3f));
    uVar10 = (ulong)(uVar7 == 2) << (bVar5 & 0x3f);
    uVar11 = (ulong)(uVar7 == 3) << (bVar5 & 0x3f);
    uVar2 = r->d[0];
    r->d[0] = r->d[0] + uVar4;
    puVar1 = r->d + 1;
    uVar4 = (ulong)CARRY8(uVar2,uVar4);
    uVar2 = *puVar1;
    uVar3 = (long)(psVar8->x).n + *puVar1;
    *puVar1 = uVar3 + uVar4;
    puVar1 = r->d + 2;
    uVar4 = (ulong)(CARRY8(uVar2,(ulong)psVar8) || CARRY8(uVar3,uVar4));
    uVar2 = *puVar1;
    uVar3 = *puVar1 + uVar10;
    *puVar1 = uVar3 + uVar4;
    puVar1 = r->d + 3;
    uVar4 = (ulong)(CARRY8(uVar2,uVar10) || CARRY8(uVar3,uVar4));
    uVar2 = *puVar1;
    uVar3 = *puVar1 + uVar11;
    *puVar1 = uVar3 + uVar4;
    secp256k1_scalar_verify(r);
    psVar9 = (secp256k1_ge *)r;
    if (!CARRY8(uVar2,uVar11) && !CARRY8(uVar3,uVar4)) {
      return;
    }
  }
  else {
    secp256k1_scalar_cadd_bit_cold_2();
  }
  secp256k1_scalar_cadd_bit_cold_1();
  a_00 = psVar8;
  a_01 = psVar9;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar9);
  if (extraout_EDX - 0x21 < 0xffffffe0) {
    secp256k1_scalar_get_bits_var_cold_4();
LAB_0014939e:
    psVar9 = a_01;
    secp256k1_scalar_get_bits_var_cold_3();
  }
  else {
    uVar6 = (uint)psVar8;
    if (0x100 < extraout_EDX + uVar6) goto LAB_0014939e;
    uVar7 = (uint)(((ulong)psVar8 & 0xffffffff) >> 6);
    if ((extraout_EDX + uVar6) - 1 >> 6 != uVar7) {
      if (uVar6 < 0xc0) {
        return;
      }
      goto LAB_001493a8;
    }
    secp256k1_scalar_verify((secp256k1_scalar *)psVar9);
    if ((extraout_EDX + uVar6) - 1 >> 6 == uVar7) {
      return;
    }
  }
  secp256k1_scalar_get_bits_var_cold_2();
  a_01 = psVar9;
LAB_001493a8:
  secp256k1_scalar_get_bits_var_cold_1();
  uStack_68 = (ulong)extraout_EDX;
  secp256k1_gej_verify(a_00);
  psVar9 = a;
  secp256k1_fe_verify(&a->x);
  if (a_00->infinity == 0) {
    secp256k1_fe_sqr(&sStack_98,&a->x);
    secp256k1_fe_mul(&sStack_c8,&sStack_98,&a->x);
    secp256k1_fe_mul(&a_01->x,&a_00->x,&sStack_98);
    secp256k1_fe_mul(&a_01->y,&a_00->y,&sStack_c8);
    a_01->infinity = a_00->infinity;
    secp256k1_ge_verify(a_01);
    return;
  }
  secp256k1_ge_set_gej_zinv_cold_1();
  psVar9->infinity = 1;
  (psVar9->x).n[0] = 0;
  (psVar9->x).n[1] = 0;
  (psVar9->x).n[2] = 0;
  (psVar9->x).n[3] = 0;
  *(undefined8 *)((long)(psVar9->x).n + 0x1c) = 0;
  *(undefined8 *)((long)(psVar9->x).n + 0x24) = 0;
  (psVar9->x).normalized = 1;
  secp256k1_fe_verify(&psVar9->x);
  *(undefined8 *)((long)(psVar9->y).n + 0x1c) = 0;
  *(undefined8 *)((long)(psVar9->y).n + 0x24) = 0;
  (psVar9->y).n[2] = 0;
  (psVar9->y).n[3] = 0;
  (psVar9->y).n[0] = 0;
  (psVar9->y).n[1] = 0;
  (psVar9->y).normalized = 1;
  secp256k1_fe_verify(&psVar9->y);
  secp256k1_ge_verify(psVar9);
  return;
}

Assistant:

static void secp256k1_scalar_cadd_bit(secp256k1_scalar *r, unsigned int bit, int flag) {
    secp256k1_uint128 t;
    volatile int vflag = flag;
    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(bit < 256);

    bit += ((uint32_t) vflag - 1) & 0x100;  /* forcing (bit >> 6) > 3 makes this a noop */
    secp256k1_u128_from_u64(&t, r->d[0]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 0)) << (bit & 0x3F));
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 1)) << (bit & 0x3F));
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 2)) << (bit & 0x3F));
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 3)) << (bit & 0x3F));
    r->d[3] = secp256k1_u128_to_u64(&t);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_u128_hi_u64(&t) == 0);
}